

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proctitle.c
# Opt level: O3

int uv_get_process_title(char *buffer,size_t size)

{
  size_t size_local;
  char *buffer_local;
  
  if ((buffer == (char *)0x0) || (size == 0)) {
    buffer_local._4_4_ = -0x16;
  }
  else if (args_mem == (void *)0x0) {
    buffer_local._4_4_ = -0x69;
  }
  else {
    uv_once(&process_title_mutex_once,init_process_title_mutex_once);
    uv_mutex_lock(&process_title_mutex);
    if (process_title.len < size) {
      if (process_title.len != 0) {
        memcpy(buffer,process_title.str,process_title.len + 1);
      }
      buffer[process_title.len] = '\0';
      uv_mutex_unlock(&process_title_mutex);
      buffer_local._4_4_ = 0;
    }
    else {
      uv_mutex_unlock(&process_title_mutex);
      buffer_local._4_4_ = -0x69;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int uv_get_process_title(char* buffer, size_t size) {
  if (buffer == NULL || size == 0)
    return UV_EINVAL;

  /* If uv_setup_args wasn't called or failed, we can't continue. */
  if (args_mem == NULL)
    return UV_ENOBUFS;

  uv_once(&process_title_mutex_once, init_process_title_mutex_once);
  uv_mutex_lock(&process_title_mutex);

  if (size <= process_title.len) {
    uv_mutex_unlock(&process_title_mutex);
    return UV_ENOBUFS;
  }

  if (process_title.len != 0)
    memcpy(buffer, process_title.str, process_title.len + 1);

  buffer[process_title.len] = '\0';

  uv_mutex_unlock(&process_title_mutex);

  return 0;
}